

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

int32_t rle16_count_less(rle16_t *array,int32_t lenarray,uint16_t key)

{
  int iVar1;
  uint16_t max_value;
  uint16_t min_value;
  int32_t middleIndex;
  int32_t high;
  int32_t low;
  uint16_t key_local;
  int32_t lenarray_local;
  rle16_t *array_local;
  int32_t local_4;
  
  if (lenarray == 0) {
    local_4 = 0;
  }
  else {
    low = 0;
    high = lenarray + -1;
    while (low <= high) {
      iVar1 = low + high >> 1;
      if ((ushort)(array[iVar1].value + array[iVar1].length) + 1 < (uint)key) {
        low = iVar1 + 1;
      }
      else {
        if (array[iVar1].value <= key) {
          return iVar1;
        }
        high = iVar1 + -1;
      }
    }
    local_4 = low;
  }
  return local_4;
}

Assistant:

static inline int32_t rle16_count_less(const rle16_t *array, int32_t lenarray,
                                       uint16_t key) {
    if (lenarray == 0) return 0;
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t min_value = array[middleIndex].value;
        uint16_t max_value =
            array[middleIndex].value + array[middleIndex].length;
        if (max_value + UINT32_C(1) < key) {  // uint32 arithmetic
            low = middleIndex + 1;
        } else if (key < min_value) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return low;
}